

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined8 generator_00;
  pointer ppFVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  UnknownFieldSet *unknown_fields_00;
  _Base_ptr p_Var7;
  Reflection *this_00;
  _Base_ptr p_Var8;
  undefined1 auVar9 [8];
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  long lVar10;
  pointer pUVar11;
  undefined1 local_a8 [8];
  ArrayInputStream input;
  undefined1 auStack_78 [8];
  UnknownFieldSet unknown_fields;
  undefined1 auStack_58 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  if (this_00 == (Reflection *)0x0) {
    auStack_78 = (undefined1  [8])0x0;
    unknown_fields.fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unknown_fields.fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    MessageLite::SerializeAsString_abi_cxx11_((string *)auStack_58,&message->super_MessageLite);
    io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)local_a8,(void *)auStack_58,
               (int)fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,-1);
    UnknownFieldSet::ParseFromZeroCopyStream
              ((UnknownFieldSet *)auStack_78,(ZeroCopyInputStream *)local_a8);
    if (auStack_58 !=
        (undefined1  [8])
        &fields.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete((void *)auStack_58);
    }
    PrintUnknownFields(this,(UnknownFieldSet *)auStack_78,generator,10);
    auVar9 = auStack_78;
    if (auStack_78 !=
        (undefined1  [8])
        unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      UnknownFieldSet::ClearFallback((UnknownFieldSet *)auStack_78);
      auVar9 = auStack_78;
    }
  }
  else {
    iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
    uVar6 = CONCAT44(extraout_var,iVar5);
    p_Var1 = &(this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = (this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar6]) {
      if (*(ulong *)(p_Var8 + 1) >= uVar6) {
        p_Var7 = p_Var8;
      }
    }
    p_Var8 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var8 = p_Var7, uVar6 < *(ulong *)(p_Var7 + 1)))
    {
      p_Var8 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      (**(code **)(*(long *)p_Var8[1]._M_parent + 0x10))
                (p_Var8[1]._M_parent,message,this->single_line_mode_,generator);
      return;
    }
    iVar5 = std::__cxx11::string::compare(*(char **)(uVar6 + 8));
    if (((iVar5 == 0) && (this->expand_any_ == true)) &&
       (bVar4 = PrintAny(this,message,generator), bVar4)) {
      return;
    }
    auStack_58 = (undefined1  [8])0x0;
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (*(char *)(*(long *)(uVar6 + 0x20) + 0x4b) == '\x01') {
      local_a8 = *(undefined1 (*) [8])(uVar6 + 0x28);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)auStack_58,(iterator)0x0,(FieldDescriptor **)local_a8);
      local_a8 = (undefined1  [8])(*(long *)(uVar6 + 0x28) + 0x98);
      if (fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)auStack_58,
                   (iterator)
                   fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,(FieldDescriptor **)local_a8);
      }
      else {
        *fields.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_start = (FieldDescriptor *)local_a8;
        fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    else {
      Reflection::ListFields
                (this_00,message,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)auStack_58);
    }
    ppFVar3 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar9 = auStack_58;
    input._24_8_ = generator;
    if ((this->print_message_fields_in_index_order_ == true) &&
       (auStack_58 !=
        (undefined1  [8])
        fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      lVar10 = (long)fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58;
      uVar6 = lVar10 >> 3;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                (auStack_58,
                 fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar10 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                  (auVar9,ppFVar3);
      }
      else {
        pUVar11 = (pointer)((long)auVar9 + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                  (auVar9,pUVar11);
        for (; pUVar11 != (pointer)ppFVar3; pUVar11 = (pointer)&pUVar11->data_) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                    (pUVar11);
        }
      }
    }
    generator_00 = input._24_8_;
    if ((undefined1  [8])
        fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_58) {
      uVar6 = 0;
      do {
        PrintField(this,message,this_00,*(FieldDescriptor **)((long)auStack_58 + uVar6 * 8),
                   (TextGenerator *)generator_00);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >>
                              3));
    }
    auVar9 = auStack_58;
    if (this->hide_unknown_fields_ == false) {
      unknown_fields_00 = Reflection::GetUnknownFields(this_00,message);
      PrintUnknownFields(this,unknown_fields_00,(TextGenerator *)generator_00,10);
      auVar9 = auStack_58;
    }
  }
  if (auVar9 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar9);
  }
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                TextGenerator* generator) const {
  const Reflection* reflection = message.GetReflection();
  if (!reflection) {
    // This message does not provide any way to describe its structure.
    // Parse it again in an UnknownFieldSet, and display this instead.
    UnknownFieldSet unknown_fields;
    {
      std::string serialized = message.SerializeAsString();
      io::ArrayInputStream input(serialized.data(), serialized.size());
      unknown_fields.ParseFromZeroCopyStream(&input);
    }
    PrintUnknownFields(unknown_fields, generator, kUnknownFieldRecursionLimit);
    return;
  }
  const Descriptor* descriptor = message.GetDescriptor();
  auto itr = custom_message_printers_.find(descriptor);
  if (itr != custom_message_printers_.end()) {
    itr->second->Print(message, single_line_mode_, generator);
    return;
  }
  if (descriptor->full_name() == internal::kAnyFullTypeName && expand_any_ &&
      PrintAny(message, generator)) {
    return;
  }
  std::vector<const FieldDescriptor*> fields;
  if (descriptor->options().map_entry()) {
    fields.push_back(descriptor->field(0));
    fields.push_back(descriptor->field(1));
  } else {
    reflection->ListFields(message, &fields);
  }

  if (print_message_fields_in_index_order_) {
    std::sort(fields.begin(), fields.end(), FieldIndexSorter());
  }
  for (int i = 0; i < fields.size(); i++) {
    PrintField(message, reflection, fields[i], generator);
  }
  if (!hide_unknown_fields_) {
    PrintUnknownFields(reflection->GetUnknownFields(message), generator,
                       kUnknownFieldRecursionLimit);
  }
}